

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

int monster_detect(obj *otmp,int mclass)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  level *lev;
  boolean bVar4;
  int iVar5;
  monst *pmVar6;
  char *pcVar7;
  
  pmVar6 = (monst *)&level->monlist;
  do {
    pmVar6 = pmVar6->nmon;
    if (pmVar6 == (monst *)0x0) {
      if (otmp == (obj *)0x0) {
        return 1;
      }
      pcVar7 = "You feel threatened.";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar7 = "You get the heebie jeebies.";
        }
        else {
          bVar4 = dmgtype(youmonst.data,0x24);
          pcVar7 = "You feel threatened.";
          if (bVar4 == '\0') {
            pcVar7 = "You get the heebie jeebies.";
          }
        }
      }
      strange_feeling(otmp,pcVar7);
      return 1;
    }
  } while (pmVar6->mhp < 1);
  cls();
  pmVar6 = level->monlist;
  if (pmVar6 == (monst *)0x0) {
    display_self();
    pcVar7 = "You sense the presence of monsters.";
  }
  else {
    bVar3 = false;
    do {
      lev = level;
      if (0 < pmVar6->mhp) {
        if (mclass == 0) {
LAB_00160f0b:
          cVar1 = pmVar6->mx;
          if ('\0' < cVar1) {
            cVar2 = pmVar6->my;
            if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
               ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0'))))
            {
              iVar5 = (int)pmVar6->mnum;
            }
            else {
              iVar5 = display_rng(0x193);
            }
            dbuf_set(lev,(int)cVar1,(int)cVar2,(rm *)0x0,0,0,0,0,0,0,0,iVar5 + 1,0,0);
            if (pmVar6->data == mons + 0x76) {
              detect_wsegs(pmVar6,'\0');
            }
          }
        }
        else if ((pmVar6->data->mlet == mclass) || (mclass == 0x3b && pmVar6->data == mons + 0x76))
        goto LAB_00160f0b;
        if (((otmp != (obj *)0x0) && ((otmp->field_0x4a & 1) != 0)) &&
           ((*(uint *)&pmVar6->field_0x60 & 0xc0000) != 0x40000)) {
          pmVar6->mfrozen = '\0';
          *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xfff3ffff | 0x40000;
          bVar3 = true;
        }
      }
      pmVar6 = pmVar6->nmon;
    } while (pmVar6 != (monst *)0x0);
    display_self();
    pline("You sense the presence of monsters.");
    if (!bVar3) goto LAB_00161090;
    pcVar7 = "Monsters sense the presence of you.";
  }
  pline(pcVar7);
LAB_00161090:
  (*windowprocs.win_pause)(P_MAP);
  doredraw();
  if ((u._1052_1_ & 2) != 0) {
    under_water(2);
  }
  if ((u._1052_1_ & 0x20) != 0) {
    under_ground(2);
  }
  return 0;
}

Assistant:

int monster_detect(struct obj *otmp,	/* detecting object (if any) */
		   int mclass		/* monster class, 0 for all */)
{
    struct monst *mtmp;
    int mcnt = 0;


    /* Note: This used to just check level->monlist for a non-zero value
     * but in versions since 3.3.0 level->monlist can test TRUE due to the
     * presence of dmons, so we have to find at least one
     * with positive hit-points to know for sure.
     */
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
    	if (!DEADMONSTER(mtmp)) {
		mcnt++;
		break;
	}

    if (!mcnt) {
	if (otmp)
	    strange_feeling(otmp, Hallucination ?
			    "You get the heebie jeebies." :
			    "You feel threatened.");
	return 1;
    } else {
	boolean woken = FALSE;

	cls();
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    if (!mclass || mtmp->data->mlet == mclass ||
		(mtmp->data == &mons[PM_LONG_WORM] && mclass == S_WORM_TAIL))
		    if (mtmp->mx > 0) {
			dbuf_set(level, mtmp->mx, mtmp->my, NULL, S_unexplored,
				 0, 0, 0, 0, 0,
				 0, dbuf_monid(mtmp), 0, 0);
			/* don't be stingy - display entire worm */
			if (mtmp->data == &mons[PM_LONG_WORM])
			    detect_wsegs(mtmp,0);
		    }
	    if (otmp && otmp->cursed &&
		(mtmp->msleeping || !mtmp->mcanmove)) {
		mtmp->msleeping = mtmp->mfrozen = 0;
		mtmp->mcanmove = 1;
		woken = TRUE;
	    }
	}
	display_self();
	pline("You sense the presence of monsters.");
	if (woken)
	    pline("Monsters sense the presence of you.");
	win_pause_output(P_MAP);
	doredraw();
	if (Underwater) under_water(2);
	if (u.uburied) under_ground(2);
    }
    return 0;
}